

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

void __thiscall
jsoncons::
sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
::uninitialized_init
          (sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
           *this,index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                 *items,size_t count)

{
  key_value_container_type *this_00;
  long lVar1;
  index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *__lhs;
  bool bVar2;
  polymorphic_allocator<char> local_60;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> local_58;
  
  if (count != 0) {
    this_00 = &this->members_;
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
    ::reserve(this_00,count);
    std::
    __sort<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const&,jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const&)>>
              (items,items + count,
               (_Iter_comp_iter<bool_(*)(const_jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_&,_const_jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_&)>
                )0x608de2);
    local_60._M_resource =
         (this->super_allocator_holder<std::pmr::polymorphic_allocator<char>_>).alloc_._M_resource;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
    ::basic_string(&local_58,(items->name)._M_dataplus._M_p,(items->name)._M_string_length,&local_60
                  );
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
    ::
    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
              ((vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
                *)this_00,&local_58,&items->value);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
    ::~basic_string(&local_58);
    lVar1 = count - 1;
    __lhs = items + 1;
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      bVar2 = std::operator!=(&__lhs->name,&__lhs[-1].name);
      if (bVar2) {
        local_60._M_resource =
             (this->super_allocator_holder<std::pmr::polymorphic_allocator<char>_>).alloc_.
             _M_resource;
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
        basic_string(&local_58,(__lhs->name)._M_dataplus._M_p,(__lhs->name)._M_string_length,
                     &local_60);
        std::
        vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
        ::
        emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
                  ((vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
                    *)this_00,&local_58,&__lhs->value);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
        ~basic_string(&local_58);
      }
      __lhs = __lhs + 1;
    }
  }
  return;
}

Assistant:

void uninitialized_init(index_key_value<Json>* items, std::size_t count)
        {
            if (count > 0)
            {
                members_.reserve(count);

                std::sort(items, items+count, compare);
                members_.emplace_back(key_type(items[0].name.data(), items[0].name.size(), get_allocator()), std::move(items[0].value));
                
                for (std::size_t i = 1; i < count; ++i)
                {
                    auto& item = items[i];
                    if (item.name != items[i-1].name)
                    {
                        members_.emplace_back(key_type(item.name.data(), item.name.size(), get_allocator()), std::move(item.value));
                    }
                }
            }
        }